

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O2

string * __thiscall
google::protobuf::io::SimpleDtoa_abi_cxx11_(string *__return_storage_ptr__,io *this,double value)

{
  int iVar1;
  LogMessageFatal local_58;
  double local_48;
  double parsed_value;
  char buffer [32];
  int local_14;
  
  local_48 = value;
  if (value < INFINITY) {
    if (-INFINITY < value) {
      if (!NAN(value)) {
        local_58.super_LogMessage._0_8_ = "%.*g";
        local_58.super_LogMessage.data_._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
              )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                )0x4;
        parsed_value = (double)CONCAT44(parsed_value._4_4_,0xf);
        iVar1 = absl::lts_20250127::SNPrintF<int,_double>
                          (buffer,0x20,(FormatSpec<int,_double> *)&local_58,(int *)&parsed_value,
                           &local_48);
        if (iVar1 - 0x20U < 0xffffffe1) {
          iVar1 = 0xe2;
LAB_00c9e7de:
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_58,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/strtod.cc"
                     ,iVar1,"snprintf_result > 0 && snprintf_result < kDoubleToBufferSize");
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_58);
        }
        parsed_value = NoLocaleStrtod(buffer,(char **)0x0);
        if ((parsed_value != local_48) || (NAN(parsed_value) || NAN(local_48))) {
          local_58.super_LogMessage._0_8_ = "%.*g";
          local_58.super_LogMessage.data_._M_t.
          super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          ._M_t.
          super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
          .
          super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                  )0x4;
          local_14 = 0x11;
          iVar1 = absl::lts_20250127::SNPrintF<int,_double>
                            (buffer,0x20,(FormatSpec<int,_double> *)&local_58,&local_14,&local_48);
          if (iVar1 - 0x20U < 0xffffffe1) {
            iVar1 = 0xf0;
            goto LAB_00c9e7de;
          }
        }
        anon_unknown_0::DelocalizeRadix(buffer);
        goto LAB_00c9e6e7;
      }
      local_58.super_LogMessage._0_8_ = "nan";
      goto LAB_00c9e6a7;
    }
    local_58.super_LogMessage._0_8_ = "-inf";
    local_58.super_LogMessage.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )&DAT_00000004;
  }
  else {
    local_58.super_LogMessage._0_8_ = "inf";
LAB_00c9e6a7:
    local_58.super_LogMessage.data_._M_t.
    super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    ._M_t.
    super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
    .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
    _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                    )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      )0x3;
  }
  absl::lts_20250127::SNPrintF<>(buffer,0x20,(FormatSpec<> *)&local_58);
LAB_00c9e6e7:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buffer,(allocator<char> *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleDtoa(double value) {
  char buffer[kDoubleToBufferSize];
  return DoubleToBuffer(value, buffer);
}